

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRT.cpp
# Opt level: O0

EndPoint __thiscall Outputs::CRT::CRT::end_point(CRT *this,uint16_t data_offset)

{
  EndPoint EVar1;
  int iVar2;
  pointer pFVar3;
  int *piVar4;
  int local_34;
  int lost_precision;
  int local_2c;
  int local_28;
  uint16_t local_22;
  CRT *pCStack_20;
  uint16_t data_offset_local;
  CRT *this_local;
  EndPoint end_point;
  
  local_22 = data_offset;
  pCStack_20 = this;
  pFVar3 = std::unique_ptr<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>::
           operator->(&this->horizontal_flywheel_);
  local_28 = Flywheel::get_current_output_position(pFVar3);
  local_2c = 0xffff;
  piVar4 = std::min<int>(&local_28,&local_2c);
  this_local._6_2_ = (undefined2)*piVar4;
  pFVar3 = std::unique_ptr<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>::
           operator->(&this->vertical_flywheel_);
  iVar2 = Flywheel::get_current_output_position(pFVar3);
  lost_precision = iVar2 / this->vertical_flywheel_output_divider_;
  local_34 = 0xffff;
  piVar4 = std::min<int>(&lost_precision,&local_34);
  EVar1.y = (short)*piVar4;
  EVar1.x = this_local._6_2_;
  EVar1.data_offset = local_22;
  EVar1.composite_angle =
       (short)(((this->phase_numerator_ -
                (long)(this->cycles_since_horizontal_sync_ % this->time_multiplier_) *
                this->colour_cycle_numerator_) * 0x40) / this->phase_denominator_) *
       (-(this->is_alternate_line_ & 1) | 1);
  EVar1.cycles_since_end_of_horizontal_retrace =
       (uint16_t)(this->cycles_since_horizontal_sync_ / this->time_multiplier_);
  return EVar1;
}

Assistant:

Outputs::Display::ScanTarget::Scan::EndPoint CRT::end_point(uint16_t data_offset) {
	Display::ScanTarget::Scan::EndPoint end_point;

	// Clamp the available range on endpoints. These will almost always be within range, but may go
	// out during times of resync.
	end_point.x = uint16_t(std::min(horizontal_flywheel_->get_current_output_position(), 65535));
	end_point.y = uint16_t(std::min(vertical_flywheel_->get_current_output_position() / vertical_flywheel_output_divider_, 65535));
	end_point.data_offset = data_offset;

	// Ensure .composite_angle is sampled at the location indicated by .cycles_since_end_of_horizontal_retrace.
	// TODO: I could supply time_multiplier_ as a modal and just not round .cycles_since_end_of_horizontal_retrace. Would that be better?
	const auto lost_precision = cycles_since_horizontal_sync_ % time_multiplier_;
	end_point.composite_angle = int16_t(((phase_numerator_ - lost_precision * colour_cycle_numerator_) << 6) / phase_denominator_) * (is_alternate_line_ ? -1 : 1);
	end_point.cycles_since_end_of_horizontal_retrace = uint16_t(cycles_since_horizontal_sync_ / time_multiplier_);

	return end_point;
}